

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

ostream * lest::operator<<(ostream *os,comment *note)

{
  size_type sVar1;
  ostream *poVar2;
  allocator local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58 [32];
  string local_38 [32];
  
  sVar1 = (note->info)._M_string_length;
  if (sVar1 == 0) {
    std::__cxx11::string::string(local_38,"",&local_79);
    std::__cxx11::string::string((string *)&local_78,local_38);
    std::__cxx11::string::string(local_58,(string *)&local_78);
  }
  else {
    std::operator+(&local_78," ",&note->info);
    std::__cxx11::string::string(local_58,(string *)&local_78);
  }
  poVar2 = std::operator<<(os,local_58);
  std::__cxx11::string::_M_dispose();
  if (sVar1 == 0) {
    std::__cxx11::string::_M_dispose();
  }
  std::__cxx11::string::_M_dispose();
  return poVar2;
}

Assistant:

inline std::ostream & operator<<( std::ostream & os, comment note )
{
    return os << (note ? " " + note.info : "" );
}